

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

section * __thiscall ELFIO::elfio::Sections::add(Sections *this,string *name)

{
  Elf_Word EVar1;
  elfio *peVar2;
  reference ppsVar3;
  string *in_RSI;
  string *in_RDI;
  Elf_Word pos;
  string_section_accessor str_writer;
  section *string_table;
  Elf_Half str_index;
  section *new_section;
  elfio *this_00;
  string_section_accessor_template<ELFIO::section> local_58;
  section *local_50;
  Elf_Half local_46;
  elfio *in_stack_ffffffffffffffc8;
  
  peVar2 = (elfio *)create_section(in_stack_ffffffffffffffc8);
  this_00 = peVar2;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RSI);
  (*(code *)(((this_00->sections).parent)->sections_).
            super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
            super__Vector_impl_data._M_finish)(this_00,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  local_46 = get_section_name_str_index(this_00);
  ppsVar3 = std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::operator[]
                      ((vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_> *)
                       (*(long *)in_RDI + 0x18),(ulong)local_46);
  local_50 = *ppsVar3;
  string_section_accessor_template<ELFIO::section>::string_section_accessor_template
            (&local_58,local_50);
  EVar1 = string_section_accessor_template<ELFIO::section>::add_string
                    ((string_section_accessor_template<ELFIO::section> *)this_00,in_RDI);
  (*(code *)(peVar2->sections).parent[2].sections.parent)(peVar2,(ulong)EVar1);
  return (section *)peVar2;
}

Assistant:

section* add( const std::string& name )
        {
            section* new_section = parent->create_section();
            new_section->set_name( name );

            Elf_Half str_index = parent->get_section_name_str_index();
            section* string_table( parent->sections_[str_index] );
            string_section_accessor str_writer( string_table );
            Elf_Word pos = str_writer.add_string( name );
            new_section->set_name_string_offset( pos );

            return new_section;
        }